

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::invalid_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *expr,string *expected)

{
  invalid_argument *this_00;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  expression_t::to_string_abi_cxx11_
            (&local_c0,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
  std::operator+(&local_a0,"invalid expression \'",&local_c0);
  std::operator+(&local_80,&local_a0,"\' where ");
  std::operator+(&local_60,&local_80,expected);
  std::operator+(&local_40,&local_60," is expected.");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void invalid_expression(tchecker::typed_expression_t const & expr, std::string expected)
  {
    throw std::invalid_argument("invalid expression '" + expr.to_string() + "' where " + expected + " is expected.");
  }